

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

TextPos __thiscall wasm::WATParser::Lexer::position(Lexer *this,char *c)

{
  TextPos TVar1;
  const_pointer pvVar2;
  size_type sVar3;
  char *local_30;
  char *p;
  char *c_local;
  Lexer *this_local;
  TextPos pos;
  
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->buffer);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->buffer);
  if ((ulong)((long)c - (long)pvVar2) <= sVar3) {
    this_local = (Lexer *)0x1;
    pos.line = 0;
    for (local_30 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->buffer);
        local_30 != c; local_30 = local_30 + 1) {
      if (*local_30 == '\n') {
        this_local = (Lexer *)((long)&(this_local->buffer)._M_len + 1);
        pos.line = 0;
      }
      else {
        pos.line = pos.line + 1;
      }
    }
    TVar1.col = pos.line;
    TVar1.line = (size_t)this_local;
    return TVar1;
  }
  __assert_fail("size_t(c - buffer.data()) <= buffer.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-lexer.cpp"
                ,0x3b6,"TextPos wasm::WATParser::Lexer::position(const char *) const");
}

Assistant:

TextPos Lexer::position(const char* c) const {
  assert(size_t(c - buffer.data()) <= buffer.size());
  TextPos pos{1, 0};
  for (const char* p = buffer.data(); p != c; ++p) {
    if (*p == '\n') {
      pos.line++;
      pos.col = 0;
    } else {
      pos.col++;
    }
  }
  return pos;
}